

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.cpp
# Opt level: O2

void __thiscall OpenMD::Component::validate(Component *this)

{
  int iVar1;
  pointer pcVar2;
  string local_70 [8];
  long local_68;
  undefined8 local_50 [4];
  
  if ((this->Type).super_ParameterBase.empty_ == false) {
    isNotEmpty();
    std::__cxx11::string::string(local_70,(string *)&(this->Type).data_);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string((string *)local_50);
    if (local_68 == 0) {
      pcVar2 = (this->Type).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNotEmpty();
      std::__cxx11::string::string((string *)local_50,local_70);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar2,local_50[0]);
      std::__cxx11::string::~string((string *)local_50);
      std::__cxx11::string::~string(local_70);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->NMol).super_ParameterBase.empty_ == false) {
    isPositive();
    iVar1 = *(int *)&(this->NMol).super_ParameterBase.field_0x2c;
    std::__cxx11::string::~string((string *)local_50);
    if (iVar1 < 1) {
      pcVar2 = (this->NMol).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)local_50,local_70);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar2,local_50[0]);
      std::__cxx11::string::~string((string *)local_50);
      std::__cxx11::string::~string(local_70);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->Region).super_ParameterBase.empty_ == false) {
    isNonNegative();
    iVar1 = *(int *)&(this->Region).super_ParameterBase.field_0x2c;
    std::__cxx11::string::~string((string *)local_50);
    if (iVar1 < 0) {
      pcVar2 = (this->Region).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      std::__cxx11::string::string((string *)local_50,local_70);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar2,local_50[0]);
      std::__cxx11::string::~string((string *)local_50);
      std::__cxx11::string::~string(local_70);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void Component::validate() {
    CheckParameter(Type, isNotEmpty());
    CheckParameter(NMol, isPositive());
    CheckParameter(Region, isNonNegative());
  }